

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testProcrustesWithMatrix<double>(M44d *m)

{
  ostream *poVar1;
  Vec3<double> *v;
  Matrix44<double> *m_00;
  double c;
  Matrix44<double> *in_stack_00000038;
  ostream *in_stack_00000040;
  V3d toPt;
  V3d fromPt;
  size_t i;
  size_t numPoints;
  Rand48 random;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> toPoints;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> fromPoints;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *in_stack_00000838;
  vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *in_stack_00000840;
  value_type *in_stack_fffffffffffffef8;
  Vec3<double> *in_stack_ffffffffffffff00;
  Vec3<double> *in_stack_ffffffffffffff10;
  Vec3<double> local_c0;
  Vec3<double> local_a8;
  Vec3<double> local_90;
  Vec3<double> local_78;
  ulong local_60;
  ulong local_58;
  
  std::operator<<((ostream *)&std::cout,"Testing Procrustes algorithm with arbitrary matrix: \n");
  Imath_3_2::operator<<(in_stack_00000040,in_stack_00000038);
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::vector
            ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)0x19640f)
  ;
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::vector
            ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)0x19641c)
  ;
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)in_stack_ffffffffffffff00,(unsigned_long)in_stack_fffffffffffffef8);
  std::operator<<((ostream *)&std::cout,"   numPoints: ");
  for (local_58 = 1; local_58 < 10; local_58 = local_58 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_58);
    poVar1 = std::operator<<(poVar1," ");
    std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
    std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::clear
              ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
               0x1964b3);
    std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::clear
              ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
               0x1964c0);
    for (local_60 = 0; local_60 < local_58; local_60 = local_60 + 1) {
      v = (Vec3<double> *)Imath_3_2::Rand48::nextf((Rand48 *)0x1964ef);
      m_00 = (Matrix44<double> *)Imath_3_2::Rand48::nextf((Rand48 *)0x196504);
      c = Imath_3_2::Rand48::nextf((Rand48 *)0x196519);
      Imath_3_2::Vec3<double>::Vec3(&local_78,(double)v,(double)m_00,c);
      Imath_3_2::operator*(v,m_00);
      in_stack_ffffffffffffff10 = &local_a8;
      Imath_3_2::Vec3<double>::Vec3(in_stack_ffffffffffffff10,&local_78);
      std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::push_back
                ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 = &local_c0;
      Imath_3_2::Vec3<double>::Vec3(in_stack_ffffffffffffff00,&local_90);
      std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::push_back
                ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    verifyProcrustes<double>(in_stack_00000840,in_stack_00000838);
  }
  std::operator<<((ostream *)&std::cout,"OK\n");
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::~vector
            ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
             in_stack_ffffffffffffff10);
  std::vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_>::~vector
            ((vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *)
             in_stack_ffffffffffffff10);
  return;
}

Assistant:

void
testProcrustesWithMatrix (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing Procrustes algorithm with arbitrary matrix: \n" << m;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> toPoints;

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    std::cout << "   numPoints: ";
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        std::cout << numPoints << " " << std::flush;
        fromPoints.clear ();
        toPoints.clear ();
        for (size_t i = 0; i < numPoints; ++i)
        {
            const IMATH_INTERNAL_NAMESPACE::V3d fromPt (
                random.nextf (), random.nextf (), random.nextf ());
            const IMATH_INTERNAL_NAMESPACE::V3d toPt = fromPt * m;
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (fromPt));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (toPt));
        }
        verifyProcrustes (fromPoints, toPoints);
    }
    std::cout << "OK\n";
}